

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

string * __thiscall cli::Parser::no_default_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"No default parameter has been specified.\n");
  std::operator<<(local_190,"The given argument must be used with a parameter.\n");
  print_help(this,(stringstream *)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string no_default() const {
			std::stringstream ss { };
			ss << "No default parameter has been specified.\n";
			ss << "The given argument must be used with a parameter.\n";
			print_help(ss);
			return ss.str();
		}